

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAxisSweep3Internal.h
# Opt level: O2

void __thiscall
cbtAxisSweep3Internal<unsigned_short>::calculateOverlappingPairs
          (cbtAxisSweep3Internal<unsigned_short> *this,cbtDispatcher *dispatcher)

{
  cbtBroadphasePair *pcVar1;
  cbtBroadphaseProxy *proxy0;
  cbtBroadphaseProxy *proxy1;
  bool bVar2;
  int iVar3;
  cbtAlignedObjectArray<cbtBroadphasePair> *this_00;
  cbtBroadphaseProxy *pcVar4;
  cbtBroadphaseProxy *pcVar5;
  long lVar6;
  undefined1 (*pauVar7) [16];
  long lVar8;
  cbtBroadphasePair local_58;
  undefined4 extraout_var;
  
  iVar3 = (*(this->m_pairCache->super_cbtOverlappingPairCallback)._vptr_cbtOverlappingPairCallback
            [0xf])();
  if ((char)iVar3 != '\0') {
    iVar3 = (*(this->m_pairCache->super_cbtOverlappingPairCallback)._vptr_cbtOverlappingPairCallback
              [7])();
    this_00 = (cbtAlignedObjectArray<cbtBroadphasePair> *)CONCAT44(extraout_var,iVar3);
    cbtAlignedObjectArray<cbtBroadphasePair>::quickSort<cbtBroadphasePairSortPredicate>
              (this_00,(cbtBroadphasePairSortPredicate *)&local_58);
    local_58 = (cbtBroadphasePair)ZEXT1632(ZEXT816(0) << 0x40);
    cbtAlignedObjectArray<cbtBroadphasePair>::resize
              (this_00,this_00->m_size - this->m_invalidPair,&local_58);
    this->m_invalidPair = 0;
    lVar8 = 0;
    pcVar4 = (cbtBroadphaseProxy *)0x0;
    pcVar5 = (cbtBroadphaseProxy *)0x0;
    for (lVar6 = 0; lVar6 < this_00->m_size; lVar6 = lVar6 + 1) {
      pcVar1 = this_00->m_data;
      proxy0 = *(cbtBroadphaseProxy **)((long)&pcVar1->m_pProxy0 + lVar8);
      proxy1 = *(cbtBroadphaseProxy **)((long)&pcVar1->m_pProxy1 + lVar8);
      if (pcVar5 == proxy1 && pcVar4 == proxy0) {
LAB_00dd69c6:
        pauVar7 = (undefined1 (*) [16])((long)&pcVar1->m_pProxy0 + lVar8);
        (*(this->m_pairCache->super_cbtOverlappingPairCallback)._vptr_cbtOverlappingPairCallback[8])
                  (this->m_pairCache,pauVar7,dispatcher);
        *pauVar7 = ZEXT816(0) << 0x40;
        this->m_invalidPair = this->m_invalidPair + 1;
      }
      else {
        bVar2 = testAabbOverlap(this,proxy0,proxy1);
        if (!bVar2) goto LAB_00dd69c6;
      }
      lVar8 = lVar8 + 0x20;
      pcVar4 = proxy0;
      pcVar5 = proxy1;
    }
    cbtAlignedObjectArray<cbtBroadphasePair>::quickSort<cbtBroadphasePairSortPredicate>
              (this_00,(cbtBroadphasePairSortPredicate *)&local_58);
    local_58 = (cbtBroadphasePair)ZEXT1632(ZEXT816(0));
    cbtAlignedObjectArray<cbtBroadphasePair>::resize
              (this_00,this_00->m_size - this->m_invalidPair,&local_58);
    this->m_invalidPair = 0;
  }
  return;
}

Assistant:

void cbtAxisSweep3Internal<BP_FP_INT_TYPE>::calculateOverlappingPairs(cbtDispatcher* dispatcher)
{
	if (m_pairCache->hasDeferredRemoval())
	{
		cbtBroadphasePairArray& overlappingPairArray = m_pairCache->getOverlappingPairArray();

		//perform a sort, to find duplicates and to sort 'invalid' pairs to the end
		overlappingPairArray.quickSort(cbtBroadphasePairSortPredicate());

		overlappingPairArray.resize(overlappingPairArray.size() - m_invalidPair);
		m_invalidPair = 0;

		int i;

		cbtBroadphasePair previousPair;
		previousPair.m_pProxy0 = 0;
		previousPair.m_pProxy1 = 0;
		previousPair.m_algorithm = 0;

		for (i = 0; i < overlappingPairArray.size(); i++)
		{
			cbtBroadphasePair& pair = overlappingPairArray[i];

			bool isDuplicate = (pair == previousPair);

			previousPair = pair;

			bool needsRemoval = false;

			if (!isDuplicate)
			{
				///important to use an AABB test that is consistent with the broadphase
				bool hasOverlap = testAabbOverlap(pair.m_pProxy0, pair.m_pProxy1);

				if (hasOverlap)
				{
					needsRemoval = false;  //callback->processOverlap(pair);
				}
				else
				{
					needsRemoval = true;
				}
			}
			else
			{
				//remove duplicate
				needsRemoval = true;
				//should have no algorithm
				cbtAssert(!pair.m_algorithm);
			}

			if (needsRemoval)
			{
				m_pairCache->cleanOverlappingPair(pair, dispatcher);

				//		m_overlappingPairArray.swap(i,m_overlappingPairArray.size()-1);
				//		m_overlappingPairArray.pop_back();
				pair.m_pProxy0 = 0;
				pair.m_pProxy1 = 0;
				m_invalidPair++;
			}
		}

///if you don't like to skip the invalid pairs in the array, execute following code:
#define CLEAN_INVALID_PAIRS 1
#ifdef CLEAN_INVALID_PAIRS

		//perform a sort, to sort 'invalid' pairs to the end
		overlappingPairArray.quickSort(cbtBroadphasePairSortPredicate());

		overlappingPairArray.resize(overlappingPairArray.size() - m_invalidPair);
		m_invalidPair = 0;
#endif  //CLEAN_INVALID_PAIRS

		//printf("overlappingPairArray.size()=%d\n",overlappingPairArray.size());
	}
}